

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::majorUpdateFtranParallel(HEkkDual *this)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  element_type *peVar5;
  HVector *pHVar6;
  HVector_ptr pHVar7;
  HVector_ptr pHVar8;
  bool bVar9;
  HighsTask *pHVar10;
  HighsSplitDeque *pHVar11;
  HEkkDual *pHVar12;
  HighsTimerClock *pHVar13;
  long *plVar14;
  ulong uVar15;
  uint end;
  HVector_ptr *ppHVar16;
  HighsInt start;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  double dVar20;
  HVector_ptr multi_vector [17];
  double multi_density [17];
  TaskGroup local_170;
  anon_class_24_3_04dd5b7a local_160;
  HVector *local_148;
  long local_140 [17];
  double local_b8 [17];
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x45,0);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this->analysis,7,(this->col_BFRT).count,(this->ekk_instance_->info_).col_aq_density);
  }
  local_b8[0] = (this->ekk_instance_->info_).col_aq_density;
  local_148 = &this->col_BFRT;
  uVar17 = 1;
  if ((this->edge_weight_mode == kSteepestEdge) && (0 < this->multi_nFinish)) {
    ppHVar16 = &this->multi_finish[0].row_ep;
    uVar15 = 1;
    do {
      if (this->analysis->analyse_simplex_summary_data == true) {
        HighsSimplexAnalysis::operationRecordBefore
                  (this->analysis,8,(*ppHVar16)->count,(this->ekk_instance_->info_).row_DSE_density)
        ;
      }
      local_b8[uVar15] = (this->ekk_instance_->info_).row_DSE_density;
      local_140[uVar15 - 1] = (long)*ppHVar16;
      uVar17 = uVar15 + 1;
      ppHVar16 = ppHVar16 + 0xf;
      bVar9 = (long)uVar15 < (long)this->multi_nFinish;
      uVar15 = uVar17;
    } while (bVar9);
  }
  if (0 < this->multi_nFinish) {
    ppHVar16 = &this->multi_finish[0].col_aq;
    lVar19 = 0;
    do {
      if (this->analysis->analyse_simplex_summary_data == true) {
        HighsSimplexAnalysis::operationRecordBefore
                  (this->analysis,6,(*ppHVar16)->count,(this->ekk_instance_->info_).col_aq_density);
      }
      local_b8[(uVar17 & 0xffffffff) + lVar19] = (this->ekk_instance_->info_).col_aq_density;
      local_140[(uVar17 & 0xffffffff) + lVar19 + -1] = (long)*ppHVar16;
      lVar19 = lVar19 + 1;
      ppHVar16 = ppHVar16 + 0xf;
    } while (lVar19 < this->multi_nFinish);
    uVar17 = (ulong)(uint)((int)uVar17 + (int)lVar19);
  }
  dVar20 = local_b8[0];
  pHVar6 = local_148;
  local_160.multi_vector = (HVector_ptr (*) [17])&local_148;
  local_160.multi_density = &local_b8;
  local_160.this = this;
  if ((uint)uVar17 < 2) {
    if ((uint)uVar17 == 1) {
      pHVar13 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(this->analysis);
      HSimplexNla::ftran(&this->ekk_instance_->simplex_nla_,pHVar6,dVar20,pHVar13);
    }
  }
  else {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar14 = (long *)__tls_get_addr(&PTR_00449ef0);
    local_170.workerDeque = (HighsSplitDeque *)*plVar14;
    local_170.dequeHead = ((local_170.workerDeque)->ownerData).head;
    do {
      pHVar11 = local_170.workerDeque;
      uVar18 = uVar17 >> 1 & 0x7fffffff;
      uVar3 = ((local_170.workerDeque)->ownerData).head;
      uVar15 = (ulong)uVar3;
      start = (HighsInt)uVar18;
      end = (uint)uVar17;
      if (uVar15 < 0x2000) {
        ((local_170.workerDeque)->ownerData).head = uVar3 + 1;
        ((local_170.workerDeque)->taskArray)._M_elems[uVar15].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_170.workerDeque)->taskArray)._M_elems[uVar15].taskData =
             &PTR_operator___00449490;
        *(HighsInt *)(((local_170.workerDeque)->taskArray)._M_elems[uVar15].taskData + 8) = start;
        *(uint *)(((local_170.workerDeque)->taskArray)._M_elems[uVar15].taskData + 0xc) = end;
        pHVar10 = ((local_170.workerDeque)->taskArray)._M_elems + uVar15;
        pHVar10->taskData[0x10] = '\x01';
        pHVar10->taskData[0x11] = '\0';
        pHVar10->taskData[0x12] = '\0';
        pHVar10->taskData[0x13] = '\0';
        *(anon_class_24_3_04dd5b7a **)
         (((local_170.workerDeque)->taskArray)._M_elems[uVar15].taskData + 0x18) = &local_160;
        if (((local_170.workerDeque)->ownerData).allStolenCopy == true) {
          uVar4 = ((local_170.workerDeque)->ownerData).head;
          ((local_170.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               CONCAT44(uVar4 - 1,uVar4);
          ((local_170.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_170.workerDeque)->ownerData).splitCopy = ((local_170.workerDeque)->ownerData).head
          ;
          ((local_170.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_170.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_170.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar5 = ((local_170.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var2._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
          (peVar5->haveJobs).super___atomic_base<int>._M_i =
               (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var2._M_i < ((local_170.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_170.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_170.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_170.workerDeque);
        }
      }
      else {
        if ((((local_170.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_170.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_170.workerDeque);
        }
        puVar1 = &(pHVar11->ownerData).head;
        *puVar1 = *puVar1 + 1;
        ::highs::parallel::for_each<HEkkDual::majorUpdateFtranParallel()::__0&>
                  (start,end,&local_160,1);
      }
      pHVar12 = local_160.this;
      uVar17 = uVar18;
    } while (3 < end);
    if (1 < end) {
      pHVar6 = (*local_160.multi_vector)[0];
      dVar20 = (*local_160.multi_density)[0];
      pHVar13 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer((local_160.this)->analysis);
      HSimplexNla::ftran(&pHVar12->ekk_instance_->simplex_nla_,pHVar6,dVar20,pHVar13);
    }
    ::highs::parallel::TaskGroup::taskWait(&local_170);
    ::highs::parallel::TaskGroup::~TaskGroup(&local_170);
  }
  if (0 < (long)this->multi_nFinish) {
    dVar20 = this->ekk_instance_->total_synthetic_tick_;
    lVar19 = 0;
    do {
      dVar20 = dVar20 + *(double *)(*(long *)((long)&this->multi_finish[0].col_aq + lVar19) + 0x38)
               + *(double *)(*(long *)((long)&this->multi_finish[0].row_ep + lVar19) + 0x38);
      lVar19 = lVar19 + 0x78;
    } while ((long)this->multi_nFinish * 0x78 - lVar19 != 0);
    this->ekk_instance_->total_synthetic_tick_ = dVar20;
  }
  if (this->analysis->analyse_simplex_summary_data != false) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,7,(this->col_BFRT).count);
  }
  if (0 < this->multi_nFinish) {
    ppHVar16 = &this->multi_finish[0].col_aq;
    lVar19 = 0;
    do {
      pHVar7 = *ppHVar16;
      pHVar8 = ppHVar16[-1];
      HEkk::updateOperationResultDensity
                (this->ekk_instance_,(double)pHVar7->count / (double)this->solver_num_row,
                 &(this->ekk_instance_->info_).col_aq_density);
      if (this->analysis->analyse_simplex_summary_data == true) {
        HighsSimplexAnalysis::operationRecordAfter(this->analysis,6,pHVar7->count);
      }
      if (this->edge_weight_mode == kSteepestEdge) {
        HEkk::updateOperationResultDensity
                  (this->ekk_instance_,(double)pHVar8->count / (double)this->solver_num_row,
                   &(this->ekk_instance_->info_).row_DSE_density);
        if (this->analysis->analyse_simplex_summary_data == true) {
          HighsSimplexAnalysis::operationRecordAfter(this->analysis,8,pHVar8->count);
        }
      }
      lVar19 = lVar19 + 1;
      ppHVar16 = ppHVar16 + 0xf;
    } while (lVar19 < this->multi_nFinish);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x45,0);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranParallel() {
  analysis->simplexTimerStart(FtranMixParClock);

  // Prepare buffers
  HighsInt multi_ntasks = 0;
  double multi_density[kSimplexConcurrencyLimit * 2 + 1];
  HVector_ptr multi_vector[kSimplexConcurrencyLimit * 2 + 1];
  // BFRT first
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtranBfrt, col_BFRT.count,
                                    ekk_instance_.info_.col_aq_density);
  multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
  multi_vector[multi_ntasks] = &col_BFRT;
  multi_ntasks++;
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    // Then DSE
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordBefore(kSimplexNlaFtranDse,
                                        multi_finish[iFn].row_ep->count,
                                        ekk_instance_.info_.row_DSE_density);
      multi_density[multi_ntasks] = ekk_instance_.info_.row_DSE_density;
      multi_vector[multi_ntasks] = multi_finish[iFn].row_ep;
      multi_ntasks++;
    }
  }
  // Then Column
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordBefore(kSimplexNlaFtran,
                                      multi_finish[iFn].col_aq->count,
                                      ekk_instance_.info_.col_aq_density);
    multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
    multi_vector[multi_ntasks] = multi_finish[iFn].col_aq;
    multi_ntasks++;
  }

  // Perform FTRAN
  // #pragma omp parallel for schedule(dynamic, 1)
  // printf("majorUpdateFtranParallel: starting %d tasks\n", multi_ntasks);
  highs::parallel::for_each(0, multi_ntasks, [&](HighsInt start, HighsInt end) {
    for (HighsInt i = start; i < end; i++) {
      HVector_ptr rhs = multi_vector[i];
      double density = multi_density[i];
      HighsTimerClock* factor_timer_clock_pointer =
          analysis->getThreadFactorTimerClockPointer();
      ekk_instance_.simplex_nla_.ftran(*rhs, density,
                                       factor_timer_clock_pointer);
    }
  });

  // Update ticks
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    ekk_instance_.total_synthetic_tick_ += Col->synthetic_tick;
    ekk_instance_.total_synthetic_tick_ += Row->synthetic_tick;
  }

  // Update rates
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtranBfrt, col_BFRT.count);
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    const double local_col_aq_density = (double)Col->count / solver_num_row;
    ekk_instance_.updateOperationResultDensity(
        local_col_aq_density, ekk_instance_.info_.col_aq_density);
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordAfter(kSimplexNlaFtran, Col->count);
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      const double local_row_DSE_density = (double)Row->count / solver_num_row;
      ekk_instance_.updateOperationResultDensity(
          local_row_DSE_density, ekk_instance_.info_.row_DSE_density);
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordAfter(kSimplexNlaFtranDse, Row->count);
    }
  }
  analysis->simplexTimerStop(FtranMixParClock);
}